

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

UniValue * __thiscall
RPCTestingSetup::CallRPC(UniValue *__return_storage_ptr__,RPCTestingSetup *this,string args)

{
  long lVar1;
  bool bVar2;
  size_t *in_RDX;
  char in_R8B;
  long in_FS_OFFSET;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vArgs;
  UniValue local_1f0;
  JSONRPCRequest request;
  string strMethod;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (char *)0x20;
  str._M_len = *in_RDX;
  util::SplitString_abi_cxx11_(&vArgs,(util *)in_RDX[1],str,in_R8B);
  std::__cxx11::string::string
            ((string *)&strMethod,
             vArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&vArgs,(const_iterator)
                 vArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  JSONRPCRequest::JSONRPCRequest(&request);
  local_1f0._0_8_ =
       &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node;
  std::any::operator=(&request.context,(NodeContext **)&local_1f0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&request.strMethod,&strMethod);
  RPCConvertValues(&local_1f0,&strMethod,&vArgs);
  UniValue::operator=(&request.params,&local_1f0);
  UniValue::~UniValue(&local_1f0);
  bVar2 = RPCIsInWarmup((string *)0x0);
  if (bVar2) {
    SetRPCWarmupFinished();
  }
  CRPCTable::execute(__return_storage_ptr__,&tableRPC,&request);
  JSONRPCRequest::~JSONRPCRequest(&request);
  std::__cxx11::string::~string((string *)&strMethod);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vArgs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCTestingSetup::CallRPC(std::string args)
{
    std::vector<std::string> vArgs{SplitString(args, ' ')};
    std::string strMethod = vArgs[0];
    vArgs.erase(vArgs.begin());
    JSONRPCRequest request;
    request.context = &m_node;
    request.strMethod = strMethod;
    request.params = RPCConvertValues(strMethod, vArgs);
    if (RPCIsInWarmup(nullptr)) SetRPCWarmupFinished();
    try {
        UniValue result = tableRPC.execute(request);
        return result;
    }
    catch (const UniValue& objError) {
        throw std::runtime_error(objError.find_value("message").get_str());
    }
}